

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void ftxui::Render(Screen *screen,Node *node)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Status status;
  int local_30;
  char local_2c;
  
  iVar1 = screen->dimx_;
  local_30 = 0;
  lVar3 = (ulong)(screen->dimy_ - 1) << 0x20;
  local_2c = '\0';
  (*node->_vptr_Node[5])(node,&local_30);
  lVar2 = (ulong)(iVar1 - 1) << 0x20;
  while ((local_2c == '\x01' && (local_30 < 0x14))) {
    (*node->_vptr_Node[2])(node);
    (*node->_vptr_Node[3])(node,lVar2,lVar3);
    local_2c = '\0';
    local_30 = local_30 + 1;
    (*node->_vptr_Node[5])(node,&local_30);
  }
  (screen->stencil).x_min = (int)lVar2;
  (screen->stencil).x_max = (int)((ulong)lVar2 >> 0x20);
  (screen->stencil).y_min = (int)lVar3;
  (screen->stencil).y_max = (int)((ulong)lVar3 >> 0x20);
  (*node->_vptr_Node[4])(node,screen);
  Screen::ApplyShader(screen);
  return;
}

Assistant:

void Render(Screen& screen, Node* node) {
  Box box;
  box.x_min = 0;
  box.y_min = 0;
  box.x_max = screen.dimx() - 1;
  box.y_max = screen.dimy() - 1;

  Node::Status status;
  node->Check(&status);
  const int max_iterations = 20;
  while (status.need_iteration && status.iteration < max_iterations) {
    // Step 1: Find what dimension this elements wants to be.
    node->ComputeRequirement();

    // Step 2: Assign a dimension to the element.
    node->SetBox(box);

    // Check if the element needs another iteration of the layout algorithm.
    status.need_iteration = false;
    status.iteration++;
    node->Check(&status);
  }

  // Step 3: Draw the element.
  screen.stencil = box;
  node->Render(screen);

  // Step 4: Apply shaders
  screen.ApplyShader();
}